

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  uint uVar1;
  internal *this_00;
  ostream *poVar2;
  int in_ECX;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  ExpectationBase *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  this_00 = (internal *)file(this);
  uVar1 = line(this);
  FormatFileLocation_abi_cxx11_(&local_38,this_00,(char *)(ulong)uVar1,in_ECX);
  poVar2 = std::operator<<(os,(string *)&local_38);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }